

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::PrintSExpression(PrintSExpression *this,ostream *o)

{
  bool bVar1;
  ostream *o_local;
  PrintSExpression *this_local;
  
  this->o = o;
  this->indent = 0;
  this->full = false;
  std::optional<wasm::ModuleStackIR>::optional(&this->moduleStackIR);
  this->currModule = (Module *)0x0;
  this->currFunction = (Function *)0x0;
  std::optional<wasm::Function::DebugLocation>::optional(&this->lastPrintedLocation);
  this->controlFlowDepth = 0;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&this->heapTypes);
  std::
  unordered_map<wasm::Signature,_wasm::HeapType,_std::hash<wasm::Signature>,_std::equal_to<wasm::Signature>,_std::allocator<std::pair<const_wasm::Signature,_wasm::HeapType>_>_>
  ::unordered_map(&this->signatureTypes);
  this->lastPrintIndent = 0;
  TypePrinter::TypePrinter(&this->typePrinter,this,&this->heapTypes);
  setMinify(this,false);
  if ((this->full & 1U) == 0) {
    bVar1 = anon_unknown_0::isFullForced();
    this->full = bVar1;
  }
  return;
}

Assistant:

PrintSExpression(std::ostream& o) : o(o), typePrinter(*this, heapTypes) {
    setMinify(false);
    if (!full) {
      full = isFullForced();
    }
  }